

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space.cpp
# Opt level: O3

void init_styles(void)

{
  bool bVar1;
  Am_Value *this;
  Am_Image_Array *this_00;
  Am_Style aAStack_48 [8];
  Am_Image_Array SP_Phaser_Stipple;
  Am_Image_Array local_38 [8];
  Am_Image_Array local_30 [8];
  Am_Image_Array local_28 [8];
  Am_Image_Array local_20 [8];
  Am_Image_Array local_18 [8];
  Am_Image_Array local_10 [8];
  
  Am_Image_Array::Am_Image_Array(&SP_Phaser_Stipple,0x19);
  this = (Am_Value *)Am_Object::Get(0xf0a8,0x87);
  bVar1 = Am_Value::operator_cast_to_bool(this);
  if (bVar1) {
    Am_Style::operator=((Am_Style *)&SP_Background_Style,(Am_Style *)&Am_Motif_Gray);
    Am_Image_Array::Am_Image_Array(local_10,(Am_Image_Array *)&Am_No_Image);
    Am_Style::Am_Style((Am_Style *)0x3f800000,0,0,aAStack_48,4,1,0,0,&Am_DEFAULT_DASH_LIST,2,0,0,
                       local_10);
    Am_Style::operator=((Am_Style *)&SP_Tractor_Beam_Style,aAStack_48);
    Am_Style::~Am_Style(aAStack_48);
    Am_Image_Array::~Am_Image_Array(local_10);
    Am_Image_Array::Am_Image_Array(local_18,&SP_Phaser_Stipple);
    Am_Style::Am_Style((Am_Style *)0x3f19999a,0x3f19999a,0x3f800000,aAStack_48,4,1,0,0,
                       &Am_DEFAULT_DASH_LIST,2,2,0,local_18);
    Am_Style::operator=((Am_Style *)&SP_Federation_Phaser_Style,aAStack_48);
    Am_Style::~Am_Style(aAStack_48);
    Am_Image_Array::~Am_Image_Array(local_18);
    Am_Image_Array::Am_Image_Array(local_20,&SP_Phaser_Stipple);
    Am_Style::Am_Style((Am_Style *)0x0,0x3f800000,0,aAStack_48,4,1,0,0,&Am_DEFAULT_DASH_LIST,2,2,0,
                       local_20);
    Am_Style::operator=((Am_Style *)&SP_Klingon_Phaser_Style,aAStack_48);
    Am_Style::~Am_Style(aAStack_48);
    this_00 = local_20;
  }
  else {
    Am_Style::operator=((Am_Style *)&SP_Background_Style,(Am_Style *)&Am_White);
    Am_Image_Array::Am_Image_Array(local_28,0x4b);
    Am_Style::Am_Style((Am_Style *)0x3f800000,0x3f800000,0x3f800000,aAStack_48,4,1,0,0,
                       &Am_DEFAULT_DASH_LIST,2,2,0,local_28);
    Am_Style::operator=((Am_Style *)&SP_Tractor_Beam_Style,aAStack_48);
    Am_Style::~Am_Style(aAStack_48);
    Am_Image_Array::~Am_Image_Array(local_28);
    Am_Image_Array::Am_Image_Array(local_30,&SP_Phaser_Stipple);
    Am_Style::Am_Style((Am_Style *)0x3f800000,0x3f800000,0x3f800000,aAStack_48,4,1,0,0,
                       &Am_DEFAULT_DASH_LIST,2,2,0,local_30);
    Am_Style::operator=((Am_Style *)&SP_Federation_Phaser_Style,aAStack_48);
    Am_Style::~Am_Style(aAStack_48);
    Am_Image_Array::~Am_Image_Array(local_30);
    Am_Image_Array::Am_Image_Array(local_38,0x32);
    Am_Style::Am_Style((Am_Style *)0x3f800000,0x3f800000,0x3f800000,aAStack_48,4,1,0,0,
                       &Am_DEFAULT_DASH_LIST,2,2,0,local_38);
    Am_Style::operator=((Am_Style *)&SP_Klingon_Phaser_Style,aAStack_48);
    Am_Style::~Am_Style(aAStack_48);
    this_00 = local_38;
  }
  Am_Image_Array::~Am_Image_Array(this_00);
  Am_Image_Array::~Am_Image_Array(&SP_Phaser_Stipple);
  return;
}

Assistant:

void
init_styles()
{

  Am_Image_Array SP_Phaser_Stipple(25);

  if ((bool)Am_Screen.Get(Am_IS_COLOR)) {
    SP_Background_Style = Am_Motif_Gray;
    SP_Tractor_Beam_Style = Am_Style(1.0f, 0.0f, 0.0f, 4);
    SP_Federation_Phaser_Style =
        Am_Style(0.6f, 0.6f, 1.0f, 4, Am_CAP_BUTT, Am_JOIN_MITER, Am_LINE_SOLID,
                 Am_DEFAULT_DASH_LIST, Am_DEFAULT_DASH_LIST_LENGTH,
                 Am_FILL_STIPPLED, Am_FILL_POLY_EVEN_ODD, SP_Phaser_Stipple);
    SP_Klingon_Phaser_Style =
        Am_Style(0.0f, 1.0f, 0.0f, 4, Am_CAP_BUTT, Am_JOIN_MITER, Am_LINE_SOLID,
                 Am_DEFAULT_DASH_LIST, Am_DEFAULT_DASH_LIST_LENGTH,
                 Am_FILL_STIPPLED, Am_FILL_POLY_EVEN_ODD, SP_Phaser_Stipple);
  } else {
    SP_Background_Style = Am_White;
    SP_Tractor_Beam_Style =
        Am_Style(1.0f, 1.0f, 1.0f, 4, Am_CAP_BUTT, Am_JOIN_MITER, Am_LINE_SOLID,
                 Am_DEFAULT_DASH_LIST, Am_DEFAULT_DASH_LIST_LENGTH,
                 Am_FILL_STIPPLED, Am_FILL_POLY_EVEN_ODD, Am_Image_Array(75));
    SP_Federation_Phaser_Style =
        Am_Style(1.0f, 1.0f, 1.0f, 4, Am_CAP_BUTT, Am_JOIN_MITER, Am_LINE_SOLID,
                 Am_DEFAULT_DASH_LIST, Am_DEFAULT_DASH_LIST_LENGTH,
                 Am_FILL_STIPPLED, Am_FILL_POLY_EVEN_ODD, SP_Phaser_Stipple);
    SP_Klingon_Phaser_Style =
        Am_Style(1.0f, 1.0f, 1.0f, 4, Am_CAP_BUTT, Am_JOIN_MITER, Am_LINE_SOLID,
                 Am_DEFAULT_DASH_LIST, Am_DEFAULT_DASH_LIST_LENGTH,
                 Am_FILL_STIPPLED, Am_FILL_POLY_EVEN_ODD, Am_Image_Array(50));
  }
}